

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

void record_pipeline_flags2(StateRecorder *recorder)

{
  bool bVar1;
  VkPipeline_T *pVVar2;
  Hash local_1d8;
  Hash rt_hash [2];
  Hash compute_hash [2];
  Hash gfx_hash [2];
  VkShaderModuleCreateInfo module_info;
  VkPipelineCreateFlags2CreateInfoKHR flags2_info;
  VkRayTracingPipelineCreateInfoKHR rt_info;
  VkComputePipelineCreateInfo compute_info;
  VkGraphicsPipelineCreateInfo graphics_info;
  StateRecorder *recorder_local;
  
  memset(&compute_info.basePipelineIndex,0,0x90);
  compute_info.basePipelineIndex = 0x1c;
  memset(&rt_info.basePipelineIndex,0,0x60);
  rt_info.basePipelineIndex = 0x1d;
  memset(&flags2_info.flags,0,0x68);
  flags2_info.flags._0_4_ = 0x3b9d13ff;
  module_info.pCode = (uint32_t *)0x3ba1f5f5;
  flags2_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  flags2_info._4_4_ = 0;
  flags2_info.pNext = (void *)0x0;
  memset(gfx_hash + 1,0,0x28);
  gfx_hash[1]._0_4_ = 0x10;
  compute_info.stage._0_8_ = gfx_hash + 1;
  compute_info.stage.module = (VkShaderModule)anon_var_dwarf_1858a;
  compute_info._0_8_ = &module_info.pCode;
  rt_info._0_8_ = &module_info.pCode;
  bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline
                    (recorder,(VkGraphicsPipelineCreateInfo *)&compute_info.basePipelineIndex,
                     compute_hash + 1);
  if (!bVar1) {
    abort();
  }
  bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline
                    (recorder,(VkGraphicsPipelineCreateInfo *)&compute_info.basePipelineIndex,
                     gfx_hash);
  if (!bVar1) {
    abort();
  }
  if (compute_hash[1] != gfx_hash[0]) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)&compute_info.basePipelineIndex
                     ,(VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  bVar1 = Fossilize::Hashing::compute_hash_compute_pipeline
                    (recorder,(VkComputePipelineCreateInfo *)&rt_info.basePipelineIndex,rt_hash + 1)
  ;
  if (!bVar1) {
    abort();
  }
  compute_info.pNext._0_4_ = 1;
  bVar1 = Fossilize::Hashing::compute_hash_compute_pipeline
                    (recorder,(VkComputePipelineCreateInfo *)&rt_info.basePipelineIndex,compute_hash
                    );
  if (!bVar1) {
    abort();
  }
  if (rt_hash[1] != compute_hash[0]) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_compute_pipeline
                    (recorder,pVVar2,(VkComputePipelineCreateInfo *)&rt_info.basePipelineIndex,
                     (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  bVar1 = Fossilize::Hashing::compute_hash_raytracing_pipeline
                    (recorder,(VkRayTracingPipelineCreateInfoKHR *)&flags2_info.flags,&local_1d8);
  if (!bVar1) {
    abort();
  }
  rt_info.pNext._0_4_ = 1;
  bVar1 = Fossilize::Hashing::compute_hash_raytracing_pipeline
                    (recorder,(VkRayTracingPipelineCreateInfoKHR *)&flags2_info.flags,rt_hash);
  if (!bVar1) {
    abort();
  }
  if (local_1d8 != rt_hash[0]) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_raytracing_pipeline
                    (recorder,pVVar2,(VkRayTracingPipelineCreateInfoKHR *)&flags2_info.flags,
                     (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  flags2_info.pNext = (void *)0x800003c0;
  bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline
                    (recorder,(VkGraphicsPipelineCreateInfo *)&compute_info.basePipelineIndex,
                     gfx_hash);
  if (!bVar1) {
    abort();
  }
  bVar1 = Fossilize::Hashing::compute_hash_compute_pipeline
                    (recorder,(VkComputePipelineCreateInfo *)&rt_info.basePipelineIndex,compute_hash
                    );
  if (!bVar1) {
    abort();
  }
  bVar1 = Fossilize::Hashing::compute_hash_raytracing_pipeline
                    (recorder,(VkRayTracingPipelineCreateInfoKHR *)&flags2_info.flags,rt_hash);
  if (!bVar1) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)&compute_info.basePipelineIndex
                     ,(VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_compute_pipeline
                    (recorder,pVVar2,(VkComputePipelineCreateInfo *)&rt_info.basePipelineIndex,
                     (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_raytracing_pipeline
                    (recorder,pVVar2,(VkRayTracingPipelineCreateInfoKHR *)&flags2_info.flags,
                     (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  if (compute_hash[1] != gfx_hash[0]) {
    abort();
  }
  if (rt_hash[1] != compute_hash[0]) {
    abort();
  }
  if (local_1d8 != rt_hash[0]) {
    abort();
  }
  flags2_info.pNext = (void *)((ulong)flags2_info.pNext | 0x8000000000000000);
  bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline
                    (recorder,(VkGraphicsPipelineCreateInfo *)&compute_info.basePipelineIndex,
                     gfx_hash);
  if (!bVar1) {
    abort();
  }
  bVar1 = Fossilize::Hashing::compute_hash_compute_pipeline
                    (recorder,(VkComputePipelineCreateInfo *)&rt_info.basePipelineIndex,compute_hash
                    );
  if (!bVar1) {
    abort();
  }
  bVar1 = Fossilize::Hashing::compute_hash_raytracing_pipeline
                    (recorder,(VkRayTracingPipelineCreateInfoKHR *)&flags2_info.flags,rt_hash);
  if (!bVar1) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)&compute_info.basePipelineIndex
                     ,(VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_compute_pipeline
                    (recorder,pVVar2,(VkComputePipelineCreateInfo *)&rt_info.basePipelineIndex,
                     (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_raytracing_pipeline
                    (recorder,pVVar2,(VkRayTracingPipelineCreateInfoKHR *)&flags2_info.flags,
                     (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  if (compute_hash[1] == gfx_hash[0]) {
    abort();
  }
  if (rt_hash[1] == compute_hash[0]) {
    abort();
  }
  if (local_1d8 == rt_hash[0]) {
    abort();
  }
  flags2_info.pNext = (void *)0x8000000000000000;
  bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline
                    (recorder,(VkGraphicsPipelineCreateInfo *)&compute_info.basePipelineIndex,
                     compute_hash + 1);
  if (!bVar1) {
    abort();
  }
  bVar1 = Fossilize::Hashing::compute_hash_compute_pipeline
                    (recorder,(VkComputePipelineCreateInfo *)&rt_info.basePipelineIndex,rt_hash + 1)
  ;
  if (!bVar1) {
    abort();
  }
  bVar1 = Fossilize::Hashing::compute_hash_raytracing_pipeline
                    (recorder,(VkRayTracingPipelineCreateInfoKHR *)&flags2_info.flags,&local_1d8);
  if (!bVar1) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)&compute_info.basePipelineIndex
                     ,(VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_compute_pipeline
                    (recorder,pVVar2,(VkComputePipelineCreateInfo *)&rt_info.basePipelineIndex,
                     (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(1);
  bVar1 = Fossilize::StateRecorder::record_raytracing_pipeline
                    (recorder,pVVar2,(VkRayTracingPipelineCreateInfoKHR *)&flags2_info.flags,
                     (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  if (compute_hash[1] != gfx_hash[0]) {
    abort();
  }
  if (rt_hash[1] != compute_hash[0]) {
    abort();
  }
  if (local_1d8 != rt_hash[0]) {
    abort();
  }
  return;
}

Assistant:

static void record_pipeline_flags2(StateRecorder &recorder)
{
	VkGraphicsPipelineCreateInfo graphics_info = { VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO };
	VkComputePipelineCreateInfo compute_info = { VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO };
	VkRayTracingPipelineCreateInfoKHR rt_info = { VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR };
	VkPipelineCreateFlags2CreateInfoKHR flags2_info = { VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR };

	// To avoid compute hashing failing.
	VkShaderModuleCreateInfo module_info = { VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO };
	compute_info.stage.pNext = &module_info;
	compute_info.stage.pName = "foo";

	graphics_info.pNext = &flags2_info;
	compute_info.pNext = &flags2_info;
	rt_info.pNext = &flags2_info;

	Hash gfx_hash[2], compute_hash[2], rt_hash[2];

	// First, ensure that base flags is ignored when there is a pNext.
	if (!Hashing::compute_hash_graphics_pipeline(recorder, graphics_info, &gfx_hash[0]))
		abort();
	graphics_info.flags = 1;
	if (!Hashing::compute_hash_graphics_pipeline(recorder, graphics_info, &gfx_hash[1]))
		abort();
	if (gfx_hash[0] != gfx_hash[1])
		abort();
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(1), graphics_info, nullptr, 0))
		abort();

	if (!Hashing::compute_hash_compute_pipeline(recorder, compute_info, &compute_hash[0]))
		abort();
	compute_info.flags = 1;
	if (!Hashing::compute_hash_compute_pipeline(recorder, compute_info, &compute_hash[1]))
		abort();
	if (compute_hash[0] != compute_hash[1])
		abort();
	if (!recorder.record_compute_pipeline(fake_handle<VkPipeline>(1), compute_info, nullptr, 0))
		abort();

	if (!Hashing::compute_hash_raytracing_pipeline(recorder, rt_info, &rt_hash[0]))
		abort();
	rt_info.flags = 1;
	if (!Hashing::compute_hash_raytracing_pipeline(recorder, rt_info, &rt_hash[1]))
		abort();
	if (rt_hash[0] != rt_hash[1])
		abort();
	if (!recorder.record_raytracing_pipeline(fake_handle<VkPipeline>(1), rt_info, nullptr, 0))
		abort();

	// Ignored flags.
	flags2_info.flags =
			VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR |
			VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR |
			VK_PIPELINE_CREATE_EARLY_RETURN_ON_FAILURE_BIT_EXT |
			VK_PIPELINE_CREATE_FAIL_ON_PIPELINE_COMPILE_REQUIRED_BIT_EXT |
			VK_PIPELINE_CREATE_2_CAPTURE_DATA_BIT_KHR;
	if (!Hashing::compute_hash_graphics_pipeline(recorder, graphics_info, &gfx_hash[1]))
		abort();
	if (!Hashing::compute_hash_compute_pipeline(recorder, compute_info, &compute_hash[1]))
		abort();
	if (!Hashing::compute_hash_raytracing_pipeline(recorder, rt_info, &rt_hash[1]))
		abort();
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(1), graphics_info, nullptr, 0))
		abort();
	if (!recorder.record_compute_pipeline(fake_handle<VkPipeline>(1), compute_info, nullptr, 0))
		abort();
	if (!recorder.record_raytracing_pipeline(fake_handle<VkPipeline>(1), rt_info, nullptr, 0))
		abort();

	if (gfx_hash[0] != gfx_hash[1])
		abort();
	if (compute_hash[0] != compute_hash[1])
		abort();
	if (rt_hash[0] != rt_hash[1])
		abort();

	flags2_info.flags |= 1ull << 63;

	if (!Hashing::compute_hash_graphics_pipeline(recorder, graphics_info, &gfx_hash[1]))
		abort();
	if (!Hashing::compute_hash_compute_pipeline(recorder, compute_info, &compute_hash[1]))
		abort();
	if (!Hashing::compute_hash_raytracing_pipeline(recorder, rt_info, &rt_hash[1]))
		abort();
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(1), graphics_info, nullptr, 0))
		abort();
	if (!recorder.record_compute_pipeline(fake_handle<VkPipeline>(1), compute_info, nullptr, 0))
		abort();
	if (!recorder.record_raytracing_pipeline(fake_handle<VkPipeline>(1), rt_info, nullptr, 0))
		abort();

	if (gfx_hash[0] == gfx_hash[1])
		abort();
	if (compute_hash[0] == compute_hash[1])
		abort();
	if (rt_hash[0] == rt_hash[1])
		abort();

	flags2_info.flags = 1ull << 63;
	if (!Hashing::compute_hash_graphics_pipeline(recorder, graphics_info, &gfx_hash[0]))
		abort();
	if (!Hashing::compute_hash_compute_pipeline(recorder, compute_info, &compute_hash[0]))
		abort();
	if (!Hashing::compute_hash_raytracing_pipeline(recorder, rt_info, &rt_hash[0]))
		abort();
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(1), graphics_info, nullptr, 0))
		abort();
	if (!recorder.record_compute_pipeline(fake_handle<VkPipeline>(1), compute_info, nullptr, 0))
		abort();
	if (!recorder.record_raytracing_pipeline(fake_handle<VkPipeline>(1), rt_info, nullptr, 0))
		abort();

	if (gfx_hash[0] != gfx_hash[1])
		abort();
	if (compute_hash[0] != compute_hash[1])
		abort();
	if (rt_hash[0] != rt_hash[1])
		abort();
}